

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.hpp
# Opt level: O3

void __thiscall
vk::DebugReportMessage::DebugReportMessage
          (DebugReportMessage *this,VkDebugReportFlagsEXT flags_,
          VkDebugReportObjectTypeEXT objectType_,deUint64 object_,size_t location_,
          deInt32 messageCode_,string *layerPrefix_,string *message_)

{
  pointer pcVar1;
  
  this->flags = flags_;
  this->objectType = objectType_;
  this->object = object_;
  this->location = location_;
  this->messageCode = messageCode_;
  (this->layerPrefix)._M_dataplus._M_p = (pointer)&(this->layerPrefix).field_2;
  pcVar1 = (layerPrefix_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->layerPrefix,pcVar1,pcVar1 + layerPrefix_->_M_string_length);
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (message_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + message_->_M_string_length);
  return;
}

Assistant:

DebugReportMessage (VkDebugReportFlagsEXT		flags_,
						VkDebugReportObjectTypeEXT	objectType_,
						deUint64					object_,
						size_t						location_,
						deInt32						messageCode_,
						const std::string&			layerPrefix_,
						const std::string&			message_)
		: flags			(flags_)
		, objectType	(objectType_)
		, object		(object_)
		, location		(location_)
		, messageCode	(messageCode_)
		, layerPrefix	(layerPrefix_)
		, message		(message_)
	{}